

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::Canceler::cancel(Canceler *this,Exception *exception)

{
  AdapterBase *pAVar1;
  Exception local_1b8;
  AdapterBase *local_28;
  AdapterBase *a;
  AdapterBase *_a225;
  Exception *exception_local;
  Canceler *this_local;
  
  _a225 = (AdapterBase *)exception;
  exception_local = (Exception *)this;
  while( true ) {
    local_28 = kj::_::readMaybe<kj::Canceler::AdapterBase>(&this->list);
    if (local_28 == (AdapterBase *)0x0) break;
    a = local_28;
    AdapterBase::unlink(local_28,(char *)exception);
    pAVar1 = local_28;
    exception = &local_1b8;
    cp<kj::Exception>(exception,(Exception *)_a225);
    (**pAVar1->_vptr_AdapterBase)();
    Exception::~Exception(&local_1b8);
  }
  return;
}

Assistant:

void Canceler::cancel(const Exception& exception) {
  for (;;) {
    KJ_IF_SOME(a, list) {
      a.unlink();
      a.cancel(kj::cp(exception));
    } else {
      break;
    }
  }